

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O1

__pid_t __thiscall QWaitConditionPrivate::wait(QWaitConditionPrivate *this,void *__stat_loc)

{
  int code;
  uint code_00;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  undefined8 in_RDX;
  QDeadlineTimer deadline;
  ulong uVar1;
  
  do {
    if (__stat_loc == (void *)0x7fffffffffffffff) {
      code = pthread_cond_wait((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this);
    }
    else {
      deadline._8_8_ = in_RDX;
      deadline.t1 = (qint64)__stat_loc;
      code = wait_relative(this,deadline);
    }
  } while (code == 0 && this->wakeups == 0);
  this->waiters = this->waiters + -1;
  if (code == 0) {
    this->wakeups = this->wakeups + -1;
  }
  code_00 = pthread_mutex_unlock((pthread_mutex_t *)this);
  uVar1 = (ulong)code_00;
  if (code_00 != 0) {
    qErrnoWarning(code_00,"%s: %s failure","QWaitCondition::wait()","mutex unlock");
    uVar1 = extraout_RAX;
  }
  if (((code != 0) && (code != 0x6e)) && (code != 0)) {
    qErrnoWarning(code,"%s: %s failure","QWaitCondition::wait()","cv wait");
    uVar1 = extraout_RAX_00;
  }
  return (__pid_t)CONCAT71((int7)(uVar1 >> 8),code == 0);
}

Assistant:

bool wait(QDeadlineTimer deadline)
    {
        int code;
        forever {
            if (!deadline.isForever()) {
                code = wait_relative(deadline);
            } else {
                code = pthread_cond_wait(&cond, &mutex);
            }
            if (code == 0 && wakeups == 0) {
                // spurious wakeup
                continue;
            }
            break;
        }

        Q_ASSERT_X(waiters > 0, "QWaitCondition::wait", "internal error (waiters)");
        --waiters;
        if (code == 0) {
            Q_ASSERT_X(wakeups > 0, "QWaitCondition::wait", "internal error (wakeups)");
            --wakeups;
        }
        qt_report_pthread_error(pthread_mutex_unlock(&mutex), "QWaitCondition::wait()",
                                "mutex unlock");

        if (code && code != ETIMEDOUT)
            qt_report_pthread_error(code, "QWaitCondition::wait()", "cv wait");

        return (code == 0);
    }